

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexCache.cpp
# Opt level: O3

void __thiscall Ptex::v2_4::PtexReaderCache::pruneData(PtexReaderCache *this)

{
  size_t *psVar1;
  size_t sVar2;
  PtexCachedReader *this_00;
  long lVar3;
  ulong uVar4;
  long lVar5;
  bool bVar6;
  
  uVar4 = this->_memUsed;
  if (this->_maxMem < uVar4) {
    lVar5 = 0;
    do {
      this_00 = PtexLruList<Ptex::v2_4::PtexCachedReader,_&Ptex::v2_4::PtexCachedReader::_activeFilesItem>
                ::pop(&this->_activeFiles);
      if (this_00 == (PtexCachedReader *)0x0) break;
      LOCK();
      bVar6 = this_00->_refCount == 0;
      if (bVar6) {
        this_00->_refCount = -1;
      }
      UNLOCK();
      if (bVar6) {
        PtexReader::prune(&this_00->super_PtexReader);
        sVar2 = (this_00->super_PtexReader)._memUsed;
        lVar3 = sVar2 - this_00->_memUsedAccountedFor;
        this_00->_memUsedAccountedFor = sVar2;
        this_00->_refCount = 0;
      }
      else {
        lVar3 = 0;
      }
      lVar5 = lVar5 + lVar3;
    } while (this->_maxMem < lVar5 + uVar4);
    if (lVar5 != 0) {
      LOCK();
      psVar1 = &this->_memUsed;
      sVar2 = *psVar1;
      *psVar1 = *psVar1 + lVar5;
      UNLOCK();
      uVar4 = sVar2 + lVar5;
      if (sVar2 + lVar5 < this->_peakMemUsed) {
        uVar4 = this->_peakMemUsed;
      }
      this->_peakMemUsed = uVar4;
    }
  }
  return;
}

Assistant:

void PtexReaderCache::pruneData()
{
    size_t memUsedChangeTotal = 0;
    size_t memUsed = _memUsed;
    while (memUsed + memUsedChangeTotal > _maxMem) {
        PtexCachedReader* reader = _activeFiles.pop();
        if (!reader) break;
        size_t memUsedChange;
        if (reader->tryPrune(memUsedChange)) {
            // Note: after clearing, memUsedChange is negative
            memUsedChangeTotal += memUsedChange;
        }
    }
    adjustMemUsed(memUsedChangeTotal);
}